

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void standard_text_validate(standard_display *dp,png_const_structp pp,png_infop pi,int check_end)

{
  char local_78 [8];
  char msg [64];
  png_const_textp ppStack_30;
  png_uint_32 num_text;
  png_textp tp;
  png_infop ppStack_20;
  int check_end_local;
  png_infop pi_local;
  png_const_structp pp_local;
  standard_display *dp_local;
  
  ppStack_30 = (png_const_textp)0x0;
  tp._4_4_ = check_end;
  ppStack_20 = pi;
  pi_local = (png_infop)pp;
  pp_local = (png_const_structp)dp;
  msg._60_4_ = png_get_text(pp,pi,&stack0xffffffffffffffd0,0);
  if ((msg._60_4_ == 2) && (ppStack_30 != (png_const_textp)0x0)) {
    standard_check_text((png_const_structp)pi_local,ppStack_30,"image name",
                        (png_const_charp)(*(long *)(*(long *)pp_local + 0x1f0) + 8));
    if (tp._4_4_ != 0) {
      standard_check_text((png_const_structp)pi_local,ppStack_30 + 1,"end marker","end");
    }
  }
  else {
    sprintf(local_78,"expected two text items, got %lu",(ulong)(uint)msg._60_4_);
    png_error(pi_local,local_78);
  }
  return;
}

Assistant:

static void
standard_text_validate(standard_display *dp, png_const_structp pp,
   png_infop pi, int check_end)
{
   png_textp tp = NULL;
   png_uint_32 num_text = png_get_text(pp, pi, &tp, NULL);

   if (num_text == 2 && tp != NULL)
   {
      standard_check_text(pp, tp, "image name", dp->ps->current->name);

      /* This exists because prior to 1.5.18 the progressive reader left the
       * png_struct z_stream unreset at the end of the image, so subsequent
       * attempts to use it simply returns Z_STREAM_END.
       */
      if (check_end)
         standard_check_text(pp, tp+1, "end marker", "end");
   }

   else
   {
      char msg[64];

      sprintf(msg, "expected two text items, got %lu",
         (unsigned long)num_text);
      png_error(pp, msg);
   }
}